

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMyString.cpp
# Opt level: O0

int Find(CMyString *CS,CMyString *s)

{
  bool bVar1;
  int *next_00;
  int *next;
  int j;
  int i;
  CMyString *s_local;
  CMyString *CS_local;
  
  next_00 = (int *)malloc((long)s->length << 2);
  GenKMPNext(next_00,s);
  next._4_4_ = 0;
  next._0_4_ = 0;
  while( true ) {
    bVar1 = false;
    if (next._4_4_ < s->length) {
      bVar1 = (int)next < CS->length;
    }
    if (!bVar1) break;
    if (s->str[next._4_4_] == CS->str[(int)next]) {
      next._4_4_ = next._4_4_ + 1;
      next._0_4_ = (int)next + 1;
    }
    else if (next_00[next._4_4_] < 0) {
      next._4_4_ = 0;
      next._0_4_ = (int)next + 1;
    }
    else {
      next._4_4_ = next_00[next._4_4_];
    }
  }
  if (next._4_4_ < s->length) {
    CS_local._4_4_ = -1;
  }
  else {
    CS_local._4_4_ = (int)next - s->length;
  }
  return CS_local._4_4_;
}

Assistant:

int Find(CMyString *CS,CMyString *s)  //在本字符串中查找字符串s首次出现的位置，如果不包含s则返回0
{
    int i,j,*next = (int *)malloc(sizeof(int)*s->length);
    //构造模式s的next数组，详见求next数组的算法
    GenKMPNext(next,s);
    for(i = 0, j = 0; i<s->length && j<CS->length; )
    {
        if(s->str[i]==CS->str[j])
        {
            i++;
            j++;
        }
        else if(next[i]>=0)
            i = next[i];
        else
        {
            i = 0;
            j++;
        }
    }
    if(i >= s->length)
        return j-(s->length);  //匹配成功，返回子串的起始位置
    else
        return -1;  //匹配失败，返回-1
}